

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O1

int __thiscall jbcoin::sign(jbcoin *this,PublicKey *pk,SecretKey *sk,Slice *m)

{
  bool bVar1;
  bool bVar2;
  size_t __n;
  int iVar3;
  uchar *RS;
  secp256k1_context *ctx;
  void *__dest;
  pointer *__ptr;
  size_t len;
  uchar sig [72];
  result_type digest;
  secp256k1_ecdsa_signature sig_imp;
  sha512_half_hasher h;
  allocator local_1d1;
  size_t local_1d0;
  string local_1c8;
  string local_1a8 [2];
  result_type local_160;
  secp256k1_ecdsa_signature local_140;
  SHA512_CTX local_100;
  
  if (pk->size_ == 0x21) {
    bVar1 = true;
    if (pk->buf_[0] == 0xed) {
      bVar2 = true;
      goto LAB_001aa2a4;
    }
    bVar1 = true;
    if ((pk->buf_[0] & 0xfe) != 2) goto LAB_001aa2a0;
  }
  else {
LAB_001aa2a0:
    bVar1 = false;
  }
  bVar2 = false;
LAB_001aa2a4:
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_100,"sign: invalid type",(allocator *)local_1a8);
    LogicError((string *)&local_100);
  }
  if (bVar2) {
    RS = (uchar *)operator_new__(0x40);
    *(uchar **)this = RS;
    *(undefined8 *)(this + 8) = 0x40;
    ed25519_sign(m->data_,m->size_,sk->buf_,pk->buf_ + 1,RS);
  }
  else {
    SHA512_Init(&local_100);
    SHA512_Update(&local_100,m->data_,m->size_);
    detail::basic_sha512_half_hasher::operator_cast_to_base_uint
              (&local_160,(basic_sha512_half_hasher *)&local_100);
    ctx = secp256k1Context<void>();
    iVar3 = secp256k1_ecdsa_sign
                      (ctx,&local_140,(uchar *)&local_160,sk->buf_,nonce_function_rfc6979,
                       (void *)0x0);
    if (iVar3 != 1) {
      std::__cxx11::string::string
                ((string *)local_1a8,"sign: secp256k1_ecdsa_sign failed",(allocator *)&local_1c8);
      LogicError(local_1a8);
    }
    local_1d0 = 0x48;
    secp256k1Context<void>();
    iVar3 = secp256k1_ecdsa_signature_serialize_der(ctx,(uchar *)local_1a8,&local_1d0,&local_140);
    __n = local_1d0;
    if (iVar3 == 0) {
      std::__cxx11::string::string
                ((string *)&local_1c8,"sign: secp256k1_ecdsa_signature_serialize_der failed",
                 &local_1d1);
      LogicError(&local_1c8);
    }
    if (local_1d0 == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = operator_new__(local_1d0);
    }
    *(void **)this = __dest;
    *(size_t *)(this + 8) = __n;
    if (__n != 0) {
      memcpy(__dest,local_1a8,__n);
    }
  }
  return (int)this;
}

Assistant:

Buffer
sign (PublicKey const& pk,
    SecretKey const& sk, Slice const& m)
{
    auto const type =
        publicKeyType(pk.slice());
    if (! type)
        LogicError("sign: invalid type");
    switch(*type)
    {
    case KeyType::ed25519:
    {
        Buffer b(64);
        ed25519_sign(m.data(), m.size(),
            sk.data(), pk.data() + 1, b.data());
        return b;
    }
    case KeyType::secp256k1:
    {
        sha512_half_hasher h;
        h(m.data(), m.size());
        auto const digest =
            sha512_half_hasher::result_type(h);

        secp256k1_ecdsa_signature sig_imp;
        if(secp256k1_ecdsa_sign(
                secp256k1Context(),
                &sig_imp,
                reinterpret_cast<unsigned char const*>(
                    digest.data()),
                reinterpret_cast<unsigned char const*>(
                    sk.data()),
                secp256k1_nonce_function_rfc6979,
                nullptr) != 1)
            LogicError("sign: secp256k1_ecdsa_sign failed");

        unsigned char sig[72];
        size_t len = sizeof(sig);
        if(secp256k1_ecdsa_signature_serialize_der(
                secp256k1Context(),
                sig,
                &len,
                &sig_imp) != 1)
            LogicError("sign: secp256k1_ecdsa_signature_serialize_der failed");

        return Buffer{sig, len};
    }
    default:
        LogicError("sign: invalid type");
    }
}